

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O1

bool __thiscall pgn::find_move<(Piece)1>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  Square *pSVar1;
  U8 UVar2;
  byte bVar3;
  Square SVar4;
  bool bVar5;
  U8 UVar6;
  Square *pSVar7;
  byte bVar8;
  int iVar9;
  U8 *pUVar10;
  Move *m_00;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  long lVar14;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  SVar4 = *local_3a8.knights;
  iVar9 = local_3a8.last;
  pSVar7 = local_3a8.knights;
  while (SVar4 != no_square) {
    uVar11 = (&bitboards::nmask)[SVar4];
    uVar12 = uVar11 & local_3a8.qtarget;
    if (uVar12 != 0) {
      pUVar10 = &local_3a8.list[iVar9].type;
      do {
        lVar14 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        ((Move *)(pUVar10 + -2))->f = (U8)SVar4;
        pUVar10[-1] = (U8)lVar14;
        *pUVar10 = '\n';
        pUVar10 = pUVar10 + 3;
        iVar9 = iVar9 + 1;
        uVar12 = uVar12 & uVar12 - 1;
        local_3a8.last = iVar9;
      } while (uVar12 != 0);
    }
    uVar11 = uVar11 & local_3a8.ctarget;
    if (uVar11 != 0) {
      pUVar10 = &local_3a8.list[iVar9].type;
      do {
        lVar14 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        ((Move *)(pUVar10 + -2))->f = (U8)SVar4;
        pUVar10[-1] = (U8)lVar14;
        *pUVar10 = '\v';
        pUVar10 = pUVar10 + 3;
        iVar9 = iVar9 + 1;
        uVar11 = uVar11 & uVar11 - 1;
        local_3a8.last = iVar9;
      } while (uVar11 != 0);
    }
    pSVar1 = pSVar7 + 1;
    pSVar7 = pSVar7 + 1;
    SVar4 = *pSVar1;
  }
  bVar13 = 0 < local_3a8.last;
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar14 = 0;
    do {
      bVar5 = position::is_legal(p,m_00);
      if (bVar5) {
        if (UVar2 == '\x11') {
          bVar3 = m_00->t;
          if (*to == (uint)bVar3) {
            if (((row < 0) || (bVar8 = m_00->f, (uint)(bVar8 >> 3) != row)) &&
               ((col < 0 || (bVar8 = m_00->f, (bVar8 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e34a;
              m->f = m_00->f;
            }
            else {
              m->f = bVar8;
            }
            m->t = bVar3;
            UVar6 = m_00->type;
LAB_0011e394:
            m->type = UVar6;
            break;
          }
        }
        else {
          UVar6 = m_00->type;
          if ((m->type == UVar6) && (bVar3 = m_00->t, *to == (uint)bVar3)) {
            if (((row < 0) || (bVar8 = m_00->f, (uint)(bVar8 >> 3) != row)) &&
               ((col < 0 || (bVar8 = m_00->f, (bVar8 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e34a;
              m->f = m_00->f;
            }
            else {
              m->f = bVar8;
            }
            m->t = bVar3;
            goto LAB_0011e394;
          }
        }
      }
LAB_0011e34a:
      lVar14 = lVar14 + 1;
      m_00 = m_00 + 1;
      bVar13 = lVar14 < local_3a8.last;
    } while (lVar14 < local_3a8.last);
  }
  Movegen::~Movegen(&local_3a8);
  return bVar13;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}